

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

missing_req_arg * __thiscall
boost::runtime::specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
operator<<(missing_req_arg *__return_storage_ptr__,
          specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error> *this,
          char *val)

{
  std::__cxx11::string::append((char *)&(this->super_input_error).super_param_error.msg);
  missing_req_arg::missing_req_arg(__return_storage_ptr__,(missing_req_arg *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }